

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::nodes(Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
        *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *m)

{
  Node *pNVar1;
  long *plVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  m->mNumElements = 0;
  uVar5 = m->mMask + 1;
  if (uVar5 < 0x28f5c28f5c28f5d) {
    uVar6 = (uVar5 * 0x50) / 100;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar5 >> 2;
    uVar6 = (SUB168(auVar4 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar8 = 0xff;
  if (uVar6 < 0xff) {
    uVar8 = uVar6;
  }
  if (uVar8 + uVar5 != 0) {
    lVar9 = 0x10;
    lVar7 = 0;
    do {
      if (m->mInfo[lVar7] != '\0') {
        pNVar1 = m->mKeyVals;
        plVar2 = *(long **)((long)&(pNVar1->mData).first.field_2 + lVar9);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x10))();
        }
        plVar2 = (long *)((long)&(pNVar1->mData).first._M_dataplus._M_p + lVar9);
        *(undefined8 *)((long)&(pNVar1->mData).first.field_2 + lVar9) = 0;
        plVar3 = *(long **)((long)pNVar1 + lVar9 + -0x10);
        if (plVar2 != plVar3) {
          operator_delete(plVar3,*plVar2 + 1);
        }
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar8 + uVar5 != lVar7);
  }
  return;
}

Assistant:

void nodes(M& m) const noexcept {
            m.mNumElements = 0;
            // clear also resets mInfo to 0, that's sometimes not necessary.
            auto const numElementsWithBuffer = m.calcNumElementsWithBuffer(m.mMask + 1);

            for (size_t idx = 0; idx < numElementsWithBuffer; ++idx) {
                if (0 != m.mInfo[idx]) {
                    Node& n = m.mKeyVals[idx];
                    n.destroy(m);
                    n.~Node();
                }
            }
        }